

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_get_diag(Integer g_a,Integer g_v)

{
  undefined8 uVar1;
  int iVar2;
  Integer IVar3;
  Integer icode;
  Integer IVar4;
  Integer IVar5;
  int iVar6;
  Integer IVar7;
  undefined8 *buf;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  Integer IVar12;
  bool bVar13;
  char *ptr;
  Integer ld;
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer local_388;
  Integer vlo;
  Integer hiA [2];
  Integer loA [2];
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  bVar13 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar13) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_get_diag_");
  pnga_check_handle(g_v,"ga_get_diag_");
  pnga_inquire(g_a,&atype,&andim,adims);
  icode = atype;
  pnga_inquire(g_v,&vtype,&vndim,&vdims);
  if (andim != 2) {
    pnga_error("ga_get_diag: wrong dimension for g_a.",andim);
  }
  if (vndim != 1) {
    pnga_error("ga_get_diag: wrong dimension for g_v.",vndim);
  }
  if (adims[0] < adims[1]) {
    adims[1] = adims[0];
  }
  if (vdims != adims[1]) {
    pnga_error("ga_get_diag: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (vtype != atype) {
    pnga_error("ga_get_diag: input global arrays do not have the same data type. Global array type ="
               ,atype);
  }
  pnga_local_iterator_init(g_a,&hdl);
  while (iVar6 = pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld), IVar5 = loA[1], IVar4 = loA[0],
        IVar3 = ld, pcVar8 = ptr, iVar6 != 0) {
    if (0 < loA[0]) {
      IVar12 = loA[1];
      if (loA[1] < loA[0]) {
        IVar12 = loA[0];
      }
      IVar7 = hiA[1];
      if (hiA[0] < hiA[1]) {
        IVar7 = hiA[0];
      }
      lVar11 = IVar7 - IVar12;
      if (IVar12 <= IVar7) {
        IVar7 = GAsizeof(icode);
        buf = (undefined8 *)malloc((lVar11 + 1) * IVar7);
        if (buf == (undefined8 *)0x0) {
          pnga_error("ga_get_diag_:failed to allocate memory for the local buffer.",9999);
        }
        switch(icode) {
        case 0x3e9:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 4 + (IVar12 - IVar4) * 4;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            *(undefined4 *)((long)buf + lVar10 * 4) = *(undefined4 *)pcVar8;
            pcVar8 = pcVar8 + IVar3 * 4 + 4;
          }
          break;
        case 0x3ea:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 8 + (IVar12 - IVar4) * 8;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            buf[lVar10] = *(undefined8 *)pcVar8;
            pcVar8 = pcVar8 + IVar3 * 8 + 8;
          }
          break;
        case 0x3eb:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 4 + (IVar12 - IVar4) * 4;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            *(undefined4 *)((long)buf + lVar10 * 4) = *(undefined4 *)pcVar8;
            pcVar8 = pcVar8 + IVar3 * 4 + 4;
          }
          break;
        case 0x3ec:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 8 + (IVar12 - IVar4) * 8;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            buf[lVar10] = *(undefined8 *)pcVar8;
            pcVar8 = pcVar8 + IVar3 * 8 + 8;
          }
          break;
        default:
          pnga_error("get_diagonal_zero: wrong data type:",icode);
          break;
        case 0x3ee:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 8 + (IVar12 - IVar4) * 8;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            buf[lVar10] = *(undefined8 *)pcVar8;
            pcVar8 = pcVar8 + IVar3 * 8 + 8;
          }
          break;
        case 0x3ef:
          pcVar8 = pcVar8 + (IVar12 - IVar5) * IVar3 * 0x10 + (IVar12 - IVar4) * 0x10;
          puVar9 = buf;
          for (lVar10 = 0; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
            uVar1 = *(undefined8 *)(pcVar8 + 8);
            *puVar9 = *(undefined8 *)pcVar8;
            puVar9[1] = uVar1;
            puVar9 = puVar9 + 2;
            pcVar8 = pcVar8 + IVar3 * 0x10 + 0x10;
          }
        }
        pnga_put(g_v,&vlo,&local_388,buf,&local_388);
        free(buf);
      }
    }
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_get_diag(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_get_diag_");
  pnga_check_handle (g_v, "ga_get_diag_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_get_diag: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_get_diag: wrong dimension for g_v.", vndim);

  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_get_diag: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_get_diag: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  if(local_sync_end)pnga_sync();
}